

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalReference.cpp
# Opt level: O0

HierarchicalReference *
slang::ast::HierarchicalReference::fromLookup(Compilation *compilation,LookupResult *result)

{
  bool bVar1;
  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *this;
  undefined8 *in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RSI;
  HierarchicalReference *in_RDI;
  bitmask<slang::ast::LookupResultFlags> *in_stack_ffffffffffffffa8;
  HierarchicalReference *__s;
  pointer local_28;
  size_t local_20;
  
  this = (span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)
         ((long)in_RDX + 0x14);
  __s = in_RDI;
  ast::operator|(None,None);
  bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                    ((bitmask<slang::ast::LookupResultFlags> *)in_RDI,in_stack_ffffffffffffffa8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    HierarchicalReference(in_RDI);
    in_RDI->target = (Symbol *)*in_RDX;
    in_RDI->upwardCount = (ulong)*(uint *)(in_RDX + 2);
    SmallVectorBase<slang::ast::HierarchicalReference::Element>::copy
              ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)(in_RDX + 0x1e),in_RSI
               ,src);
    std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>::
    span<slang::ast::HierarchicalReference::Element,_18446744073709551615UL>
              (this,(span<slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)__s)
    ;
    (in_RDI->path)._M_ptr = local_28;
    (in_RDI->path)._M_extent._M_extent_value = local_20;
  }
  else {
    memset(in_RDI,0,0x28);
    HierarchicalReference(in_RDI);
  }
  return __s;
}

Assistant:

HierarchicalReference HierarchicalReference::fromLookup(Compilation& compilation,
                                                        const LookupResult& result) {
    if (!result.flags.has(LookupResultFlags::IsHierarchical | LookupResultFlags::IfacePort))
        return {};

    HierarchicalReference ref;
    ref.target = result.found;
    ref.upwardCount = result.upwardCount;
    ref.path = result.path.copy(compilation);
    return ref;
}